

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O0

llhttp_errno_t llhttp_finish(llhttp_t *parser)

{
  char cVar1;
  long lVar2;
  long in_RDI;
  llhttp_settings_t *settings;
  int err;
  llhttp_errno_t local_14;
  
  if (*(int *)(in_RDI + 0x18) != 0) {
    return HPE_OK;
  }
  cVar1 = *(char *)(in_RDI + 0x51);
  if (cVar1 != '\0') {
    if (cVar1 != '\x01') {
      if (cVar1 == '\x02') {
        *(char **)(in_RDI + 0x20) = "Invalid EOF state";
        return HPE_INVALID_EOF_STATE;
      }
      abort();
    }
    lVar2 = *(long *)(in_RDI + 0x58);
    if ((lVar2 == 0) || (*(long *)(lVar2 + 0x58) == 0)) {
      local_14 = HPE_OK;
    }
    else {
      local_14 = (**(code **)(lVar2 + 0x58))(in_RDI);
    }
    if (local_14 != HPE_OK) {
      return local_14;
    }
  }
  return HPE_OK;
}

Assistant:

llhttp_errno_t llhttp_finish(llhttp_t* parser) {
  int err;

  /* We're in an error state. Don't bother doing anything. */
  if (parser->error != 0) {
    return 0;
  }

  switch (parser->finish) {
    case HTTP_FINISH_SAFE_WITH_CB:
      CALLBACK_MAYBE(parser, on_message_complete);
      if (err != HPE_OK) return err;

    /* FALLTHROUGH */
    case HTTP_FINISH_SAFE:
      return HPE_OK;
    case HTTP_FINISH_UNSAFE:
      parser->reason = "Invalid EOF state";
      return HPE_INVALID_EOF_STATE;
    default:
      abort();
  }
}